

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

double __thiscall chrono::curiosity::Curiosity::GetRoverMass(Curiosity *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  double local_58;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,
             &(((this->m_chassis).
                super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CuriosityPart).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  local_58 = *(double *)(local_50._M_ptr + 0x2e8);
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(((this->m_diff_bar).
                super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_CuriosityPart).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  local_58 = local_58 + *(double *)(local_40._M_ptr + 0x2e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  for (lVar5 = -0x20; lVar5 != 0; lVar5 = lVar5 + 0x10) {
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(this->m_bogies)._M_elems[0].
                                 super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar5) + 0x28));
    dVar1 = *(double *)(local_50._M_ptr + 0x2e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(this->m_rocker_uprights)._M_elems[0].
                                 super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar5) + 0x28));
    dVar2 = *(double *)(local_50._M_ptr + 0x2e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(this->m_diff_links)._M_elems[2].
                                 super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar5) + 0x28));
    dVar3 = *(double *)(local_50._M_ptr + 0x2e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(this->m_bogie_uprights)._M_elems[0].
                                 super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar5) + 0x28));
    dVar4 = *(double *)(local_50._M_ptr + 0x2e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)((this->m_diff_links)._M_elems + -1) + lVar5) + 0x28));
    local_58 = local_58 + dVar1 + dVar2 + dVar3 + dVar4 + *(double *)(local_50._M_ptr + 0x2e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  for (lVar5 = 0x20; lVar5 != 0x80; lVar5 = lVar5 + 0x10) {
    std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)((this->m_wheels)._M_elems + -2) + lVar5) + 0x28));
    local_58 = local_58 + *(double *)(local_50._M_ptr + 0x2e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  return local_58;
}

Assistant:

double Curiosity::GetRoverMass() const {
    double tot_mass = m_chassis->GetBody()->GetMass() + m_diff_bar->GetBody()->GetMass();
    for (int i = 0; i < 2; i++) {
        tot_mass = tot_mass + m_rockers[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_bogies[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_diff_links[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_rocker_uprights[i]->GetBody()->GetMass();
        tot_mass = tot_mass + m_bogie_uprights[i]->GetBody()->GetMass();
    }
    for (int i = 0; i < 6; i++) {
        tot_mass = tot_mass + m_wheels[i]->GetBody()->GetMass();
    }
    return tot_mass;
}